

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::ExecuteTests(cmCTest *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  pointer ppVar5;
  cmCTestGenericHandler *pcVar6;
  void *pvVar7;
  bool collapse;
  string local_6d8 [32];
  ostringstream local_6b8 [8];
  ostringstream cmCTestLog_msg_3;
  string local_540 [32];
  undefined1 local_520 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_3a8 [8];
  string cwd;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_378;
  iterator it_1;
  ostringstream local_350 [8];
  ostringstream cmCTestLog_msg_1;
  _Self local_1d8;
  _Base_ptr local_1d0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  local_1c8;
  iterator it;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  int local_14;
  int res;
  cmCTest *this_local;
  
  if ((this->RunConfigurationScript & 1U) == 0) {
    this->ExtraVerbose = (bool)(this->Verbose & 1);
    this->Verbose = true;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
    ::_Rb_tree_iterator(&local_378);
    local_378._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
         ::begin(&this->TestingHandlers);
    while( true ) {
      cwd.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
           ::end(&this->TestingHandlers);
      bVar1 = std::operator!=(&local_378,(_Self *)((long)&cwd.field_2 + 8));
      if (!bVar1) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator->(&local_378);
      cmCTestGenericHandler::SetVerbose(ppVar5->second,(bool)(this->Verbose & 1));
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator->(&local_378);
      cmCTestGenericHandler::SetSubmitIndex(ppVar5->second,this->SubmitIndex);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
      ::operator++(&local_378);
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_3a8,(SystemTools *)0x1,collapse);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = Initialize(this,pcVar4,(cmCTestStartCommand *)0x0);
    if (iVar2 == 0) {
      local_14 = 0xc;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_520);
      poVar3 = std::operator<<((ostream *)local_520,"Problem initializing the dashboard.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x8bb,pcVar4,false);
      std::__cxx11::string::~string(local_540);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_520);
    }
    else {
      local_14 = ProcessSteps(this);
    }
    Finalize(this);
    std::__cxx11::string::~string((string *)local_3a8);
  }
  else {
    if ((this->ExtraVerbose & 1U) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      poVar3 = std::operator<<((ostream *)local_190,"* Extra verbosity turned on");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,1,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x89d,pcVar4,false);
      std::__cxx11::string::~string((string *)&it);
      std::__cxx11::ostringstream::~ostringstream(local_190);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
    ::_Rb_tree_iterator(&local_1c8);
    local_1d0 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
                ::begin(&this->TestingHandlers);
    local_1c8._M_node = local_1d0;
    while( true ) {
      local_1d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
           ::end(&this->TestingHandlers);
      bVar1 = std::operator!=(&local_1c8,&local_1d8);
      if (!bVar1) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator->(&local_1c8);
      cmCTestGenericHandler::SetVerbose(ppVar5->second,(bool)(this->ExtraVerbose & 1));
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
               ::operator->(&local_1c8);
      cmCTestGenericHandler::SetSubmitIndex(ppVar5->second,this->SubmitIndex);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
      ::operator++(&local_1c8);
    }
    pcVar6 = GetHandler(this,"script");
    cmCTestGenericHandler::SetVerbose(pcVar6,(bool)(this->Verbose & 1));
    pcVar6 = GetHandler(this,"script");
    local_14 = (*pcVar6->_vptr_cmCTestGenericHandler[1])();
    if (local_14 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_350);
      poVar3 = std::operator<<((ostream *)local_350,"running script failing returning: ");
      pvVar7 = (void *)std::ostream::operator<<(poVar3,local_14);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Log(this,0,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x8a9,pcVar4,false);
      std::__cxx11::string::~string((string *)&it_1);
      std::__cxx11::ostringstream::~ostringstream(local_350);
    }
  }
  if (local_14 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_6b8);
    poVar3 = std::operator<<((ostream *)local_6b8,"Running a test(s) failed returning : ");
    pvVar7 = (void *)std::ostream::operator<<(poVar3,local_14);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x8c3,pcVar4,false);
    std::__cxx11::string::~string(local_6d8);
    std::__cxx11::ostringstream::~ostringstream(local_6b8);
  }
  return local_14;
}

Assistant:

int cmCTest::ExecuteTests()
{
  int res;
  // call process directory
  if (this->RunConfigurationScript) {
    if (this->ExtraVerbose) {
      cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
    }
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      it->second->SetVerbose(this->ExtraVerbose);
      it->second->SetSubmitIndex(this->SubmitIndex);
    }
    this->GetHandler("script")->SetVerbose(this->Verbose);
    res = this->GetHandler("script")->ProcessHandler();
    if (res != 0) {
      cmCTestLog(this, DEBUG,
                 "running script failing returning: " << res << std::endl);
    }

  } else {
    // What is this?  -V seems to be the same as -VV,
    // and Verbose is always on in this case
    this->ExtraVerbose = this->Verbose;
    this->Verbose = true;
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      it->second->SetVerbose(this->Verbose);
      it->second->SetSubmitIndex(this->SubmitIndex);
    }
    std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
    if (!this->Initialize(cwd.c_str(), CM_NULLPTR)) {
      res = 12;
      cmCTestLog(this, ERROR_MESSAGE, "Problem initializing the dashboard."
                   << std::endl);
    } else {
      res = this->ProcessSteps();
    }
    this->Finalize();
  }
  if (res != 0) {
    cmCTestLog(this, DEBUG,
               "Running a test(s) failed returning : " << res << std::endl);
  }
  return res;
}